

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_zip.c
# Opt level: O2

wchar_t zip_read_data_zipx_lzma_alone(archive_read *a,void **buff,size_t *size,int64_t *offset)

{
  int64_t *piVar1;
  lzma_stream *plVar2;
  zip *zip;
  zip_entry *pzVar3;
  uint64_t uVar4;
  int error_number;
  lzma_ret lVar5;
  wchar_t wVar6;
  uint8_t *puVar7;
  size_t sVar8;
  void *pvVar9;
  uchar *puVar10;
  ulong uVar11;
  char *pcVar12;
  uint64_t request;
  ssize_t bytes_avail;
  undefined5 uStack_38;
  
  zip = (zip *)a->format->data;
  if (zip->decompress_init == '\0') {
    if (zip->zipx_lzma_valid != '\0') {
      lzma_end(&zip->zipx_lzma_stream);
      zip->zipx_lzma_valid = '\0';
    }
    plVar2 = &zip->zipx_lzma_stream;
    memset(plVar2,0,0x88);
    lVar5 = lzma_alone_decoder(plVar2,0xffffffffffffffff);
    if (lVar5 != LZMA_OK) {
      archive_set_error(&a->archive,-1,"lzma initialization failed(%d)",(ulong)lVar5);
      return L'\xffffffe7';
    }
    zip->zipx_lzma_valid = '\x01';
    pvVar9 = __archive_read_ahead(a,9,(ssize_t *)0x0);
    if (pvVar9 == (void *)0x0) {
      pcVar12 = "Truncated lzma data";
    }
    else {
      if ((*(char *)((long)pvVar9 + 2) == '\x05') && (*(char *)((long)pvVar9 + 3) == '\0')) {
        bytes_avail._0_4_ = *(undefined4 *)((long)pvVar9 + 4);
        bytes_avail._4_4_ = CONCAT31(0xffffff,*(undefined1 *)((long)pvVar9 + 8));
        uStack_38 = 0xffffffffff;
        puVar10 = zip->uncompressed_buffer;
        if (puVar10 == (uchar *)0x0) {
          zip->uncompressed_buffer_size = 0x40000;
          sVar8 = 0x40000;
          puVar10 = (uchar *)malloc(0x40000);
          zip->uncompressed_buffer = puVar10;
          if (puVar10 == (uchar *)0x0) {
            pcVar12 = "No memory for lzma decompression";
            error_number = 0xc;
            goto LAB_00154a63;
          }
        }
        else {
          sVar8 = zip->uncompressed_buffer_size;
        }
        (zip->zipx_lzma_stream).next_in = (uint8_t *)&bytes_avail;
        (zip->zipx_lzma_stream).avail_in = 0xd;
        (zip->zipx_lzma_stream).total_in = 0;
        (zip->zipx_lzma_stream).next_out = puVar10;
        (zip->zipx_lzma_stream).avail_out = sVar8;
        (zip->zipx_lzma_stream).total_out = 0;
        lVar5 = lzma_code(plVar2,LZMA_RUN);
        if (lVar5 != LZMA_OK) {
          pcVar12 = "lzma stream initialization error";
          error_number = 0x16;
          goto LAB_00154a63;
        }
        __archive_read_consume(a,9);
        zip->entry_bytes_remaining = zip->entry_bytes_remaining + -9;
        zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + 9;
        zip->decompress_init = '\x01';
        goto LAB_00154844;
      }
      pcVar12 = "Invalid lzma data";
    }
  }
  else {
LAB_00154844:
    puVar7 = (uint8_t *)__archive_read_ahead(a,1,&bytes_avail);
    if (-1 < bytes_avail._4_4_) {
      sVar8 = CONCAT44(bytes_avail._4_4_,(undefined4)bytes_avail);
      if (zip->entry_bytes_remaining < (long)CONCAT44(bytes_avail._4_4_,(undefined4)bytes_avail)) {
        sVar8 = zip->entry_bytes_remaining;
      }
      pzVar3 = zip->entry;
      plVar2 = &zip->zipx_lzma_stream;
      (zip->zipx_lzma_stream).next_in = puVar7;
      (zip->zipx_lzma_stream).avail_in = sVar8;
      (zip->zipx_lzma_stream).total_in = 0;
      (zip->zipx_lzma_stream).next_out = zip->uncompressed_buffer;
      sVar8 = pzVar3->uncompressed_size - zip->entry_uncompressed_bytes_read;
      if ((long)zip->uncompressed_buffer_size < (long)sVar8) {
        sVar8 = zip->uncompressed_buffer_size;
      }
      (zip->zipx_lzma_stream).avail_out = sVar8;
      (zip->zipx_lzma_stream).total_out = 0;
      lVar5 = lzma_code(plVar2,LZMA_RUN);
      if (lVar5 == LZMA_DATA_ERROR) {
        pcVar12 = "lzma data error (error %d)";
        uVar11 = 9;
LAB_00154a51:
        archive_set_error(&a->archive,-1,pcVar12,uVar11);
        return L'\xffffffe2';
      }
      if (lVar5 != LZMA_STREAM_END) {
        if (lVar5 == LZMA_OK) {
          request = (zip->zipx_lzma_stream).total_in;
LAB_001549c5:
          __archive_read_consume(a,request);
          zip->entry_compressed_bytes_read = zip->entry_compressed_bytes_read + request;
          uVar4 = (zip->zipx_lzma_stream).total_out;
          zip->entry_uncompressed_bytes_read = zip->entry_uncompressed_bytes_read + uVar4;
          piVar1 = &zip->entry_bytes_remaining;
          *piVar1 = *piVar1 - request;
          if (*piVar1 == 0) {
            zip->end_of_entry = '\x01';
          }
          *size = uVar4;
          *buff = zip->uncompressed_buffer;
          wVar6 = consume_optional_marker(a,zip);
          if (wVar6 == L'\0') {
            if (zip->end_of_entry != '\0') {
              lzma_end(plVar2);
              zip->zipx_lzma_valid = '\0';
              return L'\0';
            }
            return L'\0';
          }
          return wVar6;
        }
        pcVar12 = "lzma unknown error %d";
        uVar11 = (ulong)lVar5;
        goto LAB_00154a51;
      }
      lzma_end(plVar2);
      zip->zipx_lzma_valid = '\0';
      request = (zip->zipx_lzma_stream).total_in;
      if (request == zip->entry_bytes_remaining) {
        zip->end_of_entry = '\x01';
        goto LAB_001549c5;
      }
      pcVar12 = "lzma alone premature end of stream";
      error_number = -1;
      goto LAB_00154a63;
    }
    pcVar12 = "Truncated lzma file body";
  }
  error_number = 0x54;
LAB_00154a63:
  archive_set_error(&a->archive,error_number,pcVar12);
  return L'\xffffffe2';
}

Assistant:

static int
zip_read_data_zipx_lzma_alone(struct archive_read *a, const void **buff,
    size_t *size, int64_t *offset)
{
	struct zip* zip = (struct zip *)(a->format->data);
	int ret;
	lzma_ret lz_ret;
	const void* compressed_buf;
	ssize_t bytes_avail, in_bytes, to_consume;

	(void) offset; /* UNUSED */

	/* Initialize decompressor if not yet initialized. */
	if (!zip->decompress_init) {
		ret = zipx_lzma_alone_init(a, zip);
		if (ret != ARCHIVE_OK)
			return (ret);
	}

	/* Fetch more compressed data. The same note as in deflate handler
	 * applies here as well:
	 *
	 * Note: '1' here is a performance optimization. Recall that the
	 * decompression layer returns a count of available bytes; asking for
	 * more than that forces the decompressor to combine reads by copying
	 * data.
	 */
	compressed_buf = __archive_read_ahead(a, 1, &bytes_avail);
	if (bytes_avail < 0) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Truncated lzma file body");
		return (ARCHIVE_FATAL);
	}

	/* Set decompressor parameters. */
	in_bytes = zipmin(zip->entry_bytes_remaining, bytes_avail);

	zip->zipx_lzma_stream.next_in = compressed_buf;
	zip->zipx_lzma_stream.avail_in = in_bytes;
	zip->zipx_lzma_stream.total_in = 0;
	zip->zipx_lzma_stream.next_out = zip->uncompressed_buffer;
	zip->zipx_lzma_stream.avail_out =
		/* These lzma_alone streams lack end of stream marker, so let's
		 * make sure the unpacker won't try to unpack more than it's
		 * supposed to. */
		zipmin((int64_t) zip->uncompressed_buffer_size,
		    zip->entry->uncompressed_size -
		    zip->entry_uncompressed_bytes_read);
	zip->zipx_lzma_stream.total_out = 0;

	/* Perform the decompression. */
	lz_ret = lzma_code(&zip->zipx_lzma_stream, LZMA_RUN);
	switch(lz_ret) {
		case LZMA_DATA_ERROR:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma data error (error %d)", (int) lz_ret);
			return (ARCHIVE_FATAL);

		/* This case is optional in lzma alone format. It can happen,
		 * but most of the files don't have it. (GitHub #1257) */
		case LZMA_STREAM_END:
			lzma_end(&zip->zipx_lzma_stream);
			zip->zipx_lzma_valid = 0;
			if((int64_t) zip->zipx_lzma_stream.total_in !=
			    zip->entry_bytes_remaining)
			{
				archive_set_error(&a->archive,
				    ARCHIVE_ERRNO_MISC,
				    "lzma alone premature end of stream");
				return (ARCHIVE_FATAL);
			}

			zip->end_of_entry = 1;
			break;

		case LZMA_OK:
			break;

		default:
			archive_set_error(&a->archive, ARCHIVE_ERRNO_MISC,
			    "lzma unknown error %d", (int) lz_ret);
			return (ARCHIVE_FATAL);
	}

	to_consume = zip->zipx_lzma_stream.total_in;

	/* Update pointers. */
	__archive_read_consume(a, to_consume);
	zip->entry_bytes_remaining -= to_consume;
	zip->entry_compressed_bytes_read += to_consume;
	zip->entry_uncompressed_bytes_read += zip->zipx_lzma_stream.total_out;

	if(zip->entry_bytes_remaining == 0) {
		zip->end_of_entry = 1;
	}

	/* Return values. */
	*size = zip->zipx_lzma_stream.total_out;
	*buff = zip->uncompressed_buffer;

	/* Behave the same way as during deflate decompression. */
	ret = consume_optional_marker(a, zip);
	if (ret != ARCHIVE_OK)
		return (ret);

	/* Free lzma decoder handle because we'll no longer need it. */
	if(zip->end_of_entry) {
		lzma_end(&zip->zipx_lzma_stream);
		zip->zipx_lzma_valid = 0;
	}

	/* If we're here, then we're good! */
	return (ARCHIVE_OK);
}